

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2channel_initiate_close(SshChannel *sc,char *err)

{
  char *local_30;
  char *reason;
  ssh2_channel *c;
  char *err_local;
  SshChannel *sc_local;
  
  if (err == (char *)0x0) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = dupprintf("due to local error: %s",err);
  }
  ssh2_channel_close_local((ssh2_channel *)(sc + -0xb),local_30);
  safefree(local_30);
  *(undefined1 *)((long)&sc[-10].cl + 4) = 0;
  ssh2_channel_check_close((ssh2_channel *)(sc + -0xb));
  return;
}

Assistant:

static void ssh2channel_initiate_close(SshChannel *sc, const char *err)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    char *reason;

    reason = err ? dupprintf("due to local error: %s", err) : NULL;
    ssh2_channel_close_local(c, reason);
    sfree(reason);
    c->pending_eof = false;   /* this will confuse a zombie channel */

    ssh2_channel_check_close(c);
}